

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  byte bVar1;
  u8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  u8 *puVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  SortSubtask *pTask;
  uint local_38;
  
  bVar1 = pSorter->nTask;
  pSorter->bUsePMA = '\x01';
  if (bVar1 < 2) {
    iVar8 = 0;
    pTask = (SortSubtask *)0x0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    uVar7 = 1;
    iVar8 = 0;
    do {
      uVar6 = (long)(int)(pSorter->iPrev + uVar7) % (long)(int)(bVar1 - 1) & 0xffffffff;
      pTask = pSorter->aTask + uVar6;
      if (pSorter->aTask[uVar6].bDone != 0) {
        iVar4 = vdbeSorterJoinThread(pTask);
      }
      if (iVar4 != 0) break;
      if (pTask->pThread == (SQLiteThread *)0x0) goto LAB_0014af69;
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 + 1;
      local_38 = (uint)bVar1;
    } while (local_38 != uVar7);
    iVar8 = uVar7 - 1;
  }
LAB_0014af69:
  if (iVar4 != 0) {
    return iVar4;
  }
  if (iVar8 != bVar1 - 1) {
    puVar5 = (pTask->list).aMemory;
    pSorter->iPrev = (char)(((int)pTask - (int)pSorter) - 0x60U >> 3) * -0x3b;
    uVar3 = *(undefined4 *)&(pSorter->list).field_0x14;
    (pTask->list).szPMA = (pSorter->list).szPMA;
    *(undefined4 *)&(pTask->list).field_0x14 = uVar3;
    puVar2 = (pSorter->list).aMemory;
    (pTask->list).pList = (pSorter->list).pList;
    (pTask->list).aMemory = puVar2;
    (pSorter->list).pList = (SorterRecord *)0x0;
    (pSorter->list).szPMA = 0;
    if (puVar5 == (u8 *)0x0) {
      if ((pSorter->list).aMemory != (u8 *)0x0) {
        puVar5 = (u8 *)sqlite3Malloc((long)pSorter->nMemory);
        (pSorter->list).aMemory = puVar5;
        if (puVar5 == (u8 *)0x0) {
          return 7;
        }
      }
    }
    else {
      (pSorter->list).aMemory = puVar5;
      iVar4 = (*sqlite3Config.m.xSize)(puVar5);
      pSorter->nMemory = iVar4;
    }
    iVar4 = vdbeSorterCreateThread(pTask,vdbeSorterFlushThread,pTask);
    return iVar4;
  }
  iVar4 = vdbeSorterListToPMA(pSorter->aTask + ((ulong)bVar1 - 1),&pSorter->list);
  return iVar4;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written.
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are prefered as they use background threads - the final
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem;
      void *pCtx;

      assert( pTask!=0 );
      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      aMem = pTask->list.aMemory;
      pCtx = (void*)pTask;
      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}